

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

void __thiscall Refal2::CInternalProgramBuilder::check(CInternalProgramBuilder *this)

{
  CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  CErrorsHelper *this_01;
  CGlobalFunctionData *pCVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int index;
  string sStack_1c8;
  ostringstream stringStream;
  
  this_00 = &this->globals;
  for (index = 0; index < this_00->size; index = index + 1) {
    pCVar1 = CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::GetData(this_00,index);
    if (pCVar1->preparatoryFunction == (CPreparatoryFunction *)0x0 &&
        pCVar1->embeddedFunction == (TEmbeddedFunctionPtr)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stringStream);
      poVar2 = std::operator<<((ostream *)&stringStream,"external function `");
      pbVar3 = CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::GetKey(this_00,index);
      poVar2 = std::operator<<(poVar2,(string *)pbVar3);
      std::operator<<(poVar2,"` was not defined in program");
      this_01 = this->errors;
      std::__cxx11::stringbuf::str();
      CErrorsHelper::RaiseError(this_01,ES_LinkError,&sStack_1c8);
      std::__cxx11::string::~string((string *)&sStack_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stringStream);
    }
  }
  return;
}

Assistant:

void CInternalProgramBuilder::check()
{
	for( int globalIndex = 0; globalIndex < globals.Size(); globalIndex++ )
	{
		if( !globals.GetData( globalIndex ).IsDefined() ) {
			std::ostringstream stringStream;
			stringStream << "external function `"
				<< globals.GetKey( globalIndex ) <<
				"` was not defined in program";
			errors.RaiseError( ES_LinkError, stringStream.str() );
		}
	}
}